

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void ActionUnserialize::
     SerReadWriteMany<DataStream,unsigned_char&,transaction_identifier<false>&,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
               (DataStream *s,uchar *args,transaction_identifier<false> *args_1,
               Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *args_2)

{
  uint *puVar1;
  uint uVar2;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *__nbytes;
  long in_FS_OFFSET;
  uint8_t obj;
  uchar local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = args_2;
  DataStream::read(s,(int)&local_31,(void *)0x1,(size_t)args_2);
  *args = local_31;
  DataStream::read(s,(int)args_1,(void *)0x20,(size_t)__nbytes);
  puVar1 = args_2->m_object;
  uVar2 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
  *puVar1 = uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }